

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O2

bool __thiscall FlowGraph::DoesExitLabelDominate(FlowGraph *this,BranchInstr *leaveInstr)

{
  OpCode OVar1;
  Region *region1;
  code *pcVar2;
  bool bVar3;
  Instr *pIVar4;
  undefined4 *puVar5;
  BranchInstr *pBVar6;
  LabelInstr *pLVar7;
  Type *ppLVar8;
  FlowGraph *this_00;
  
  pLVar7 = leaveInstr->m_branchTarget;
  pIVar4 = IR::Instr::GetNextRealInstr(&pLVar7->super_Instr);
  if (pIVar4->m_kind != InstrKindBranch) {
    pIVar4 = IR::Instr::GetNextRealInstr(&pLVar7->super_Instr);
    if (pIVar4->m_opcode != ProfiledLoopEnd) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x55,
                         "(leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd)"
                         ,
                         "leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd"
                        );
      if (!bVar3) goto LAB_003f55a2;
      *puVar5 = 0;
    }
  }
  pIVar4 = IR::Instr::GetNextBranchOrLabel(&pLVar7->super_Instr);
  pBVar6 = IR::Instr::AsBranchInstr(pIVar4);
  puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
  while( true ) {
    OVar1 = (pBVar6->super_Instr).m_opcode;
    if ((OVar1 != Leave) && (OVar1 != BrOnException)) {
      if (OVar1 == Br) goto LAB_003f556a;
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                         ,0x5a,
                         "(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException)"
                         ,
                         "leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException"
                        );
      if (!bVar3) goto LAB_003f55a2;
      *puVar5 = 0;
    }
    pLVar7 = IR::Instr::AsLabelInstr((pBVar6->super_Instr).m_next);
    pIVar4 = (pLVar7->super_Instr).m_next;
    if (pIVar4->m_kind != InstrKindBranch) break;
    pBVar6 = IR::Instr::AsBranchInstr(pIVar4);
  }
  if (pIVar4->m_opcode != ProfiledLoopEnd) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0x5f,"(nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd)",
                       "nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd");
    if (!bVar3) {
LAB_003f55a2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
LAB_003f556a:
  region1 = pBVar6->m_branchTarget->m_region;
  this_00 = (FlowGraph *)this->finallyLabelStack;
  ppLVar8 = SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount>::Head
                      ((SListBase<IR::LabelInstr_*,_Memory::ArenaAllocator,_RealCount> *)this_00);
  bVar3 = Dominates(this_00,region1,(*ppLVar8)->m_region);
  return bVar3;
}

Assistant:

bool FlowGraph::DoesExitLabelDominate(IR::BranchInstr *leaveInstr)
{
    IR::LabelInstr * leaveTarget = leaveInstr->GetTarget();
    Assert(leaveTarget->GetNextRealInstr()->IsBranchInstr() || leaveTarget->GetNextRealInstr()->m_opcode == Js::OpCode::ProfiledLoopEnd);
    IR::BranchInstr *leaveChain = leaveTarget->GetNextBranchOrLabel()->AsBranchInstr();

    while (leaveChain->m_opcode != Js::OpCode::Br)
    {
        Assert(leaveChain->m_opcode == Js::OpCode::Leave || leaveChain->m_opcode == Js::OpCode::BrOnException);
        IR::LabelInstr * nextLabel = leaveChain->m_next->AsLabelInstr();
        if (!nextLabel->m_next->IsBranchInstr())
        {
            // For jit loop bodies - we can encounter ProfiledLoopEnd before every early return
            Assert(nextLabel->m_next->m_opcode == Js::OpCode::ProfiledLoopEnd);
            break;
        }
        leaveChain = nextLabel->m_next->AsBranchInstr();
    }
    IR::LabelInstr * exitLabel = leaveChain->GetTarget();
    return Dominates(exitLabel->GetRegion(), finallyLabelStack->Top()->GetRegion());
}